

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O1

HighsDebugStatus __thiscall
HEkk::debugNonbasicFreeColumnSet(HEkk *this,HighsInt num_free_col,HSet *nonbasic_free_col_set)

{
  HighsOptions *pHVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *format;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  pHVar1 = this->options_;
  if ((pHVar1->super_HighsOptionsStruct).highs_debug_level < 1) {
    return kNotChecked;
  }
  iVar3 = (this->lp_).num_row_;
  uVar6 = iVar3 + (this->lp_).num_col_;
  if (uVar6 == 0 || SCARRY4(iVar3,(this->lp_).num_col_) != (int)uVar6 < 0) {
    iVar3 = 0;
  }
  else {
    uVar7 = 0;
    iVar3 = 0;
    do {
      if (((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7] <= -INFINITY) &&
         (INFINITY <=
          (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7])) {
        iVar3 = iVar3 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (iVar3 == num_free_col) {
    if (num_free_col == 0) {
      return kOk;
    }
    bVar2 = HSet::debug(nonbasic_free_col_set);
    if (!bVar2) {
      highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,
                  "NonbasicFreeColumnData: HSet error\n");
      return kLogicalError;
    }
    if ((int)uVar6 < 1) {
      uVar4 = 0;
    }
    else {
      uVar7 = 0;
      uVar4 = 0;
      do {
        uVar8 = 0;
        if (((this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] == '\x01') &&
           ((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] <= -INFINITY)) {
          uVar8 = (uint)(INFINITY <=
                        (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]);
        }
        uVar4 = uVar4 + uVar8;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    uVar6 = nonbasic_free_col_set->count_;
    if (uVar4 == uVar6) {
      if ((int)uVar6 < 1) {
        return kOk;
      }
      uVar7 = 0;
      while( true ) {
        lVar5 = (long)(nonbasic_free_col_set->entry_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar7];
        uVar4 = (uint)(this->basis_).nonbasicFlag_.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5];
        if (((uVar4 != 1) ||
            (-INFINITY <
             (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5])) ||
           ((this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] < INFINITY)) break;
        uVar7 = uVar7 + 1;
        if (uVar6 == uVar7) {
          return kOk;
        }
      }
      highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,
                  "NonbasicFreeColumnData: Variable %d in nonbasic free set has nonbasicFlag = %d and bounds [%g, %g]\n"
                  ,(this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar5],
                  (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar5],lVar5,(ulong)uVar4);
      return kLogicalError;
    }
    format = "NonbasicFreeColumnData: Set should have %d entries, not %d\n";
  }
  else {
    format = "NonbasicFreeColumnData: Number of free columns should be %d, not %d\n";
  }
  highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,format);
  return kLogicalError;
}

Assistant:

HighsDebugStatus HEkk::debugNonbasicFreeColumnSet(
    const HighsInt num_free_col, const HSet nonbasic_free_col_set) const {
  const HighsOptions& options = *(this->options_);
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const HighsSimplexInfo& info = this->info_;
  const SimplexBasis& basis = this->basis_;
  HighsInt num_tot = lp.num_col_ + lp.num_row_;

  // Check the number of free columns
  HighsInt check_num_free_col = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (info.workLower_[iVar] <= -kHighsInf &&
        info.workUpper_[iVar] >= kHighsInf)
      check_num_free_col++;
  }
  if (check_num_free_col != num_free_col) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: Number of free columns should be "
                "%" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT "\n",
                check_num_free_col, num_free_col);
    return HighsDebugStatus::kLogicalError;
  }
  if (!num_free_col) return HighsDebugStatus::kOk;
  // Debug HSet nonbasic_free_col
  bool nonbasic_free_col_ok = nonbasic_free_col_set.debug();
  if (!nonbasic_free_col_ok) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: HSet error\n");
    return HighsDebugStatus::kLogicalError;
  }

  // Check that we have the right number of nonbasic free columns
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  HighsInt check_num_nonbasic_free_col = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    bool nonbasic_free = basis.nonbasicFlag_[iVar] == kNonbasicFlagTrue &&
                         info.workLower_[iVar] <= -kHighsInf &&
                         info.workUpper_[iVar] >= kHighsInf;
    if (nonbasic_free) check_num_nonbasic_free_col++;
  }
  if (check_num_nonbasic_free_col != num_nonbasic_free_col) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: Set should have %" HIGHSINT_FORMAT
                " entries, not %" HIGHSINT_FORMAT "\n",
                check_num_nonbasic_free_col, num_nonbasic_free_col);
    return HighsDebugStatus::kLogicalError;
  }
  // Check that all in the set are nonbasic free columns
  const vector<HighsInt>& nonbasic_free_col_set_entry =
      nonbasic_free_col_set.entry();
  for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
    HighsInt iVar = nonbasic_free_col_set_entry[ix];
    bool nonbasic_free = basis.nonbasicFlag_[iVar] == kNonbasicFlagTrue &&
                         info.workLower_[iVar] <= -kHighsInf &&
                         info.workUpper_[iVar] >= kHighsInf;
    if (!nonbasic_free) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "NonbasicFreeColumnData: Variable %" HIGHSINT_FORMAT
                  " in nonbasic free "
                  "set has nonbasicFlag = %" HIGHSINT_FORMAT
                  " and bounds [%g, %g]\n",
                  iVar, basis.nonbasicFlag_[iVar], info.workLower_[iVar],
                  info.workUpper_[iVar]);
      return HighsDebugStatus::kLogicalError;
    }
  }
  return HighsDebugStatus::kOk;
}